

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O0

void __thiscall
PartiallySignedTransaction::Unserialize<DataStream>(PartiallySignedTransaction *this,DataStream *s)

{
  uint uVar1;
  long lVar2;
  Span<const_unsigned_char> data;
  initializer_list<CExtPubKey> __l;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  uint64_t uVar6;
  size_type sVar7;
  size_type sVar8;
  uint *puVar9;
  size_type sVar10;
  size_type sVar11;
  size_type sVar12;
  reference pvVar13;
  size_type sVar14;
  char *pcVar15;
  PSBTOutput *pPVar16;
  error_code *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_bool>
  pVar17;
  uint i;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range4;
  uint64_t type;
  bool found_sep;
  vector<unsigned_char,_std::allocator<unsigned_char>_> val_bytes;
  PSBTProprietary this_prop;
  uint32_t v;
  iterator __end4;
  iterator __begin4;
  CMutableTransaction mtx;
  SpanReader skey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  KeyOriginInfo keypath;
  uint8_t magic [5];
  PSBTOutput output;
  PSBTInput input;
  CExtPubKey xpub;
  set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> global_xpubs;
  set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  key_lookup;
  PSBTInput *in_stack_fffffffffffff458;
  undefined4 in_stack_fffffffffffff460;
  io_errc in_stack_fffffffffffff464;
  DataStream *in_stack_fffffffffffff468;
  iterator in_stack_fffffffffffff470;
  error_code *peVar18;
  key_type *in_stack_fffffffffffff478;
  map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
  *in_stack_fffffffffffff480;
  PSBTOutput *in_stack_fffffffffffff488;
  ParamsWrapper<TransactionSerParams,_CMutableTransaction> *in_stack_fffffffffffff4a0;
  DataStream *in_stack_fffffffffffff4a8;
  undefined8 in_stack_fffffffffffff4e0;
  SpanReader *in_stack_fffffffffffff4e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffff4f0;
  undefined7 in_stack_fffffffffffff4f8;
  undefined1 in_stack_fffffffffffff4ff;
  uint local_8b4;
  int local_884;
  undefined8 local_610;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  DataStream::operator>>
            (in_stack_fffffffffffff468,
             (uchar (*) [5])CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
  bVar3 = std::equal<unsigned_char*,unsigned_char_const*>
                    ((uchar *)in_stack_fffffffffffff468,
                     (uchar *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460),
                     (uchar *)in_stack_fffffffffffff458);
  if (bVar3) {
    std::
    set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::set((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           *)in_stack_fffffffffffff458);
    std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>::set
              ((set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> *)
               in_stack_fffffffffffff458);
    bVar3 = false;
    do {
      bVar4 = DataStream::empty(in_stack_fffffffffffff468);
      if (((bVar4 ^ 0xffU) & 1) == 0) break;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff458)
      ;
      DataStream::operator>>
                (in_stack_fffffffffffff468,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
      bVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffff468);
      if (bVar4) {
        bVar3 = true;
        local_884 = 3;
      }
      else {
        Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((Span<const_unsigned_char> *)in_stack_fffffffffffff468,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460),
                   in_stack_fffffffffffff458);
        data.m_data._4_4_ = in_stack_fffffffffffff464;
        data.m_data._0_4_ = in_stack_fffffffffffff460;
        data.m_size = (size_t)in_stack_fffffffffffff468;
        SpanReader::SpanReader((SpanReader *)in_stack_fffffffffffff458,data);
        uVar6 = ReadCompactSize<SpanReader>
                          (in_stack_fffffffffffff4e8,
                           SUB81((ulong)in_stack_fffffffffffff4e0 >> 0x38,0));
        if (uVar6 == 0) {
          pVar17 = std::
                   set<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                   ::emplace<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                             ((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)in_stack_fffffffffffff468,
                              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
          if (((pVar17.second ^ 0xffU) & 1) != 0) {
            pcVar5 = (char *)__cxa_allocate_exception(0x20);
            std::error_code::error_code<std::io_errc,void>
                      ((error_code *)in_stack_fffffffffffff468,in_stack_fffffffffffff464);
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar5,(error_code *)"Duplicate Key, unsigned tx already provided");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_00de85a2;
          }
          sVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              in_stack_fffffffffffff458);
          if (sVar12 != 1) {
            pcVar5 = (char *)__cxa_allocate_exception(0x20);
            std::error_code::error_code<std::io_errc,void>
                      ((error_code *)in_stack_fffffffffffff468,in_stack_fffffffffffff464);
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar5,(error_code *)"Global unsigned tx key is more than one byte type");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_00de85a2;
          }
          CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff458)
          ;
          TransactionSerParams::operator()
                    ((TransactionSerParams *)in_stack_fffffffffffff468,
                     (CMutableTransaction *)
                     CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
          UnserializeFromVector<DataStream,ParamsWrapper<TransactionSerParams,CMutableTransaction>>
                    (in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
          std::optional<CMutableTransaction>::operator=
                    ((optional<CMutableTransaction> *)in_stack_fffffffffffff468,
                     (CMutableTransaction *)
                     CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
          std::optional<CMutableTransaction>::operator->
                    ((optional<CMutableTransaction> *)in_stack_fffffffffffff458);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                     CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
          std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                     CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
          while (bVar4 = __gnu_cxx::operator==<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                   ((__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                     *)in_stack_fffffffffffff468,
                                    (__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                     *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460)
                                   ), ((bVar4 ^ 0xffU) & 1) != 0) {
            __gnu_cxx::__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
            operator*((__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                      in_stack_fffffffffffff458);
            bVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                               in_stack_fffffffffffff458);
            if ((!bVar4) ||
               (bVar4 = CScriptWitness::IsNull((CScriptWitness *)in_stack_fffffffffffff458), !bVar4)
               ) {
              pcVar5 = (char *)__cxa_allocate_exception(0x20);
              std::error_code::error_code<std::io_errc,void>
                        ((error_code *)in_stack_fffffffffffff468,in_stack_fffffffffffff464);
              std::ios_base::failure[abi:cxx11]::failure
                        (pcVar5,(error_code *)
                                "Unsigned tx does not have empty scriptSigs and scriptWitnesses.");
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                            std::ios_base::failure[abi:cxx11]::~failure);
              }
              goto LAB_00de85a2;
            }
            __gnu_cxx::__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
            operator++((__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                       in_stack_fffffffffffff458);
          }
          CMutableTransaction::~CMutableTransaction
                    ((CMutableTransaction *)in_stack_fffffffffffff458);
        }
        else if (uVar6 == 1) {
          sVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              in_stack_fffffffffffff458);
          if (sVar12 != 0x4f) {
            pcVar5 = (char *)__cxa_allocate_exception(0x20);
            std::error_code::error_code<std::io_errc,void>
                      ((error_code *)in_stack_fffffffffffff468,in_stack_fffffffffffff464);
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar5,(error_code *)
                              "Size of key was not the expected size for the type global xpub");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_00de85a2;
          }
          CExtPubKey::CExtPubKey((CExtPubKey *)in_stack_fffffffffffff458);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff458);
          CExtPubKey::DecodeWithVersion((CExtPubKey *)in_stack_fffffffffffff458,(uchar *)0xde730f);
          bVar4 = CPubKey::IsFullyValid((CPubKey *)in_stack_fffffffffffff470);
          if (!bVar4) {
            pcVar5 = (char *)__cxa_allocate_exception(0x20);
            std::error_code::error_code<std::io_errc,void>
                      ((error_code *)in_stack_fffffffffffff468,in_stack_fffffffffffff464);
            std::ios_base::failure[abi:cxx11]::failure(pcVar5,(error_code *)"Invalid pubkey");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_00de85a2;
          }
          sVar7 = std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>::count
                            ((set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> *)
                             in_stack_fffffffffffff468,
                             (key_type *)
                             CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
          if (sVar7 != 0) {
            pcVar5 = (char *)__cxa_allocate_exception(0x20);
            std::error_code::error_code<std::io_errc,void>
                      ((error_code *)in_stack_fffffffffffff468,in_stack_fffffffffffff464);
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar5,(error_code *)"Duplicate key, global xpub already provided");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_00de85a2;
          }
          std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>::insert
                    ((set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> *)
                     in_stack_fffffffffffff468,
                     (value_type *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
          KeyOriginInfo::KeyOriginInfo((KeyOriginInfo *)in_stack_fffffffffffff458);
          DeserializeHDKeypath<DataStream>
                    (in_stack_fffffffffffff468,
                     (KeyOriginInfo *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460))
          ;
          sVar8 = std::
                  map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
                  ::count((map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
                           *)in_stack_fffffffffffff468,
                          (key_type *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460))
          ;
          if (sVar8 == 0) {
            std::
            map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
            ::operator[](in_stack_fffffffffffff480,in_stack_fffffffffffff478);
            __l._M_len = (size_type)in_stack_fffffffffffff478;
            __l._M_array = in_stack_fffffffffffff470;
            std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>::operator=
                      ((set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> *)
                       in_stack_fffffffffffff468,__l);
          }
          else {
            std::
            map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
            ::operator[](in_stack_fffffffffffff480,in_stack_fffffffffffff478);
            std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>::insert
                      ((set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> *)
                       in_stack_fffffffffffff468,
                       (value_type *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
          }
          KeyOriginInfo::~KeyOriginInfo((KeyOriginInfo *)in_stack_fffffffffffff458);
        }
        else if (uVar6 == 0xfb) {
          bVar4 = std::optional::operator_cast_to_bool
                            ((optional<unsigned_int> *)in_stack_fffffffffffff458);
          if (bVar4) {
            pcVar5 = (char *)__cxa_allocate_exception(0x20);
            std::error_code::error_code<std::io_errc,void>
                      ((error_code *)in_stack_fffffffffffff468,in_stack_fffffffffffff464);
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar5,(error_code *)"Duplicate Key, version already provided");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_00de85a2;
          }
          sVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              in_stack_fffffffffffff458);
          if (sVar12 != 1) {
            pcVar5 = (char *)__cxa_allocate_exception(0x20);
            std::error_code::error_code<std::io_errc,void>
                      ((error_code *)in_stack_fffffffffffff468,in_stack_fffffffffffff464);
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar5,(error_code *)"Global version key is more than one byte type");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_00de85a2;
          }
          UnserializeFromVector<DataStream,unsigned_int&>
                    (in_stack_fffffffffffff4a8,(uint *)in_stack_fffffffffffff4a0);
          std::optional<unsigned_int>::optional<unsigned_int_&,_true>
                    ((optional<unsigned_int> *)in_stack_fffffffffffff468,
                     (uint *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
          *(undefined8 *)(in_RDI + 0xd0) = local_610;
          puVar9 = std::optional<unsigned_int>::operator*
                             ((optional<unsigned_int> *)in_stack_fffffffffffff458);
          if (*puVar9 != 0) {
            pcVar5 = (char *)__cxa_allocate_exception(0x20);
            std::error_code::error_code<std::io_errc,void>
                      ((error_code *)in_stack_fffffffffffff468,in_stack_fffffffffffff464);
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar5,(error_code *)"Unsupported version number");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_00de85a2;
          }
        }
        else if (uVar6 == 0xfc) {
          PSBTProprietary::PSBTProprietary((PSBTProprietary *)in_stack_fffffffffffff458);
          SpanReader::operator>>
                    ((SpanReader *)in_stack_fffffffffffff468,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
          ReadCompactSize<SpanReader>
                    (in_stack_fffffffffffff4e8,SUB81((ulong)in_stack_fffffffffffff4e0 >> 0x38,0));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
                     in_stack_fffffffffffff4f0);
          sVar10 = std::
                   set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
                   ::count((set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
                            *)in_stack_fffffffffffff468,
                           (key_type *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460)
                          );
          if (sVar10 != 0) {
            pcVar5 = (char *)__cxa_allocate_exception(0x20);
            std::error_code::error_code<std::io_errc,void>
                      ((error_code *)in_stack_fffffffffffff468,in_stack_fffffffffffff464);
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar5,(error_code *)"Duplicate Key, proprietary key already found");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_00de85a2;
          }
          DataStream::operator>>
                    (in_stack_fffffffffffff468,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
          std::set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>::
          insert((set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
                  *)in_stack_fffffffffffff468,
                 (value_type *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
          PSBTProprietary::~PSBTProprietary((PSBTProprietary *)in_stack_fffffffffffff458);
        }
        else {
          sVar11 = std::
                   map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   ::count((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                            *)in_stack_fffffffffffff468,
                           (key_type *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460)
                          );
          if (sVar11 != 0) {
            pcVar5 = (char *)__cxa_allocate_exception(0x20);
            std::error_code::error_code<std::io_errc,void>
                      ((error_code *)in_stack_fffffffffffff468,in_stack_fffffffffffff464);
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar5,(error_code *)"Duplicate Key, key for unknown value already provided")
            ;
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_00de85a2;
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff458);
          DataStream::operator>>
                    (in_stack_fffffffffffff468,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
          std::
          map<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
          ::
          emplace<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)in_stack_fffffffffffff478,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff470,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff468);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff468);
        }
        local_884 = 0;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff468)
      ;
    } while (local_884 == 0);
    if (bVar3) {
      bVar3 = std::optional::operator_cast_to_bool
                        ((optional<CMutableTransaction> *)in_stack_fffffffffffff458);
      if (bVar3) {
        local_8b4 = 0;
        do {
          bVar4 = DataStream::empty(in_stack_fffffffffffff468);
          bVar3 = false;
          if (!bVar4) {
            std::optional<CMutableTransaction>::operator->
                      ((optional<CMutableTransaction> *)in_stack_fffffffffffff458);
            sVar12 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                               ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff458);
            bVar3 = local_8b4 < sVar12;
          }
          if (!bVar3) {
            sVar12 = std::vector<PSBTInput,_std::allocator<PSBTInput>_>::size
                               ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)
                                in_stack_fffffffffffff458);
            std::optional<CMutableTransaction>::operator->
                      ((optional<CMutableTransaction> *)in_stack_fffffffffffff458);
            sVar14 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                               ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff458);
            if (sVar12 == sVar14) {
              local_8b4 = 0;
              while( true ) {
                bVar4 = DataStream::empty(in_stack_fffffffffffff468);
                bVar3 = false;
                if (!bVar4) {
                  in_stack_fffffffffffff488 = (PSBTOutput *)(ulong)local_8b4;
                  std::optional<CMutableTransaction>::operator->
                            ((optional<CMutableTransaction> *)in_stack_fffffffffffff458);
                  pPVar16 = (PSBTOutput *)
                            std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                                       in_stack_fffffffffffff458);
                  bVar3 = in_stack_fffffffffffff488 < pPVar16;
                }
                if (!bVar3) break;
                PSBTOutput::PSBTOutput(in_stack_fffffffffffff488);
                DataStream::operator>>
                          (in_stack_fffffffffffff468,
                           (PSBTOutput *)
                           CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
                std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::push_back
                          ((vector<PSBTOutput,_std::allocator<PSBTOutput>_> *)
                           in_stack_fffffffffffff468,
                           (value_type *)
                           CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
                local_8b4 = local_8b4 + 1;
                PSBTOutput::~PSBTOutput((PSBTOutput *)in_stack_fffffffffffff458);
              }
              sVar12 = std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::size
                                 ((vector<PSBTOutput,_std::allocator<PSBTOutput>_> *)
                                  in_stack_fffffffffffff458);
              std::optional<CMutableTransaction>::operator->
                        ((optional<CMutableTransaction> *)in_stack_fffffffffffff458);
              sVar14 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                                 ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                                  in_stack_fffffffffffff458);
              if (sVar12 == sVar14) {
                std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>::~set
                          ((set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> *)
                           in_stack_fffffffffffff458);
                std::
                set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::~set((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)in_stack_fffffffffffff458);
                if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                  return;
                }
              }
              else {
                this_00 = (error_code *)__cxa_allocate_exception(0x20);
                peVar18 = this_00;
                std::error_code::error_code<std::io_errc,void>(this_00,in_stack_fffffffffffff464);
                std::ios_base::failure[abi:cxx11]::failure
                          ((char *)peVar18,
                           (error_code *)
                           "Outputs provided does not match the number of outputs in transaction.");
                if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                  __cxa_throw(this_00,&std::ios_base::failure[abi:cxx11]::typeinfo,
                              std::ios_base::failure[abi:cxx11]::~failure);
                }
              }
            }
            else {
              pcVar15 = (char *)__cxa_allocate_exception(0x20);
              pcVar5 = pcVar15;
              std::error_code::error_code<std::io_errc,void>
                        ((error_code *)in_stack_fffffffffffff468,in_stack_fffffffffffff464);
              std::ios_base::failure[abi:cxx11]::failure
                        (pcVar5,(error_code *)
                                "Inputs provided does not match the number of inputs in transaction."
                        );
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                __cxa_throw(pcVar15,&std::ios_base::failure[abi:cxx11]::typeinfo,
                            std::ios_base::failure[abi:cxx11]::~failure);
              }
            }
            goto LAB_00de85a2;
          }
          PSBTInput::PSBTInput
                    ((PSBTInput *)CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8));
          DataStream::operator>>
                    (in_stack_fffffffffffff468,
                     (PSBTInput *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
          std::vector<PSBTInput,_std::allocator<PSBTInput>_>::push_back
                    ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)in_stack_fffffffffffff468,
                     (value_type *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
          bVar3 = std::__shared_ptr::operator_cast_to_bool
                            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                             in_stack_fffffffffffff458);
          if (bVar3) {
            std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_fffffffffffff458);
            CTransaction::GetHash((CTransaction *)in_stack_fffffffffffff458);
            std::optional<CMutableTransaction>::operator->
                      ((optional<CMutableTransaction> *)in_stack_fffffffffffff458);
            std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff468,
                       CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
            in_stack_fffffffffffff4ff =
                 transaction_identifier<false>::operator!=
                           ((transaction_identifier<false> *)in_stack_fffffffffffff468,
                            (transaction_identifier<false> *)
                            CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
            if ((bool)in_stack_fffffffffffff4ff) {
              pcVar15 = (char *)__cxa_allocate_exception(0x20);
              pcVar5 = pcVar15;
              std::error_code::error_code<std::io_errc,void>
                        ((error_code *)in_stack_fffffffffffff468,in_stack_fffffffffffff464);
              std::ios_base::failure[abi:cxx11]::failure
                        (pcVar5,(error_code *)"Non-witness UTXO does not match outpoint hash");
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                __cxa_throw(pcVar15,&std::ios_base::failure[abi:cxx11]::typeinfo,
                            std::ios_base::failure[abi:cxx11]::~failure);
              }
              goto LAB_00de85a2;
            }
            std::optional<CMutableTransaction>::operator->
                      ((optional<CMutableTransaction> *)in_stack_fffffffffffff458);
            pvVar13 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                                ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff468,
                                 CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
            uVar1 = (pvVar13->prevout).n;
            std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_fffffffffffff458);
            sVar12 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                               ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff458
                               );
            if (sVar12 <= uVar1) goto code_r0x00de818c;
          }
          local_8b4 = local_8b4 + 1;
          PSBTInput::~PSBTInput(in_stack_fffffffffffff458);
        } while( true );
      }
      pcVar5 = (char *)__cxa_allocate_exception(0x20);
      std::error_code::error_code<std::io_errc,void>
                ((error_code *)in_stack_fffffffffffff468,in_stack_fffffffffffff464);
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar5,(error_code *)"No unsigned transaction was provided");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
    }
    else {
      pcVar5 = (char *)__cxa_allocate_exception(0x20);
      std::error_code::error_code<std::io_errc,void>
                ((error_code *)in_stack_fffffffffffff468,in_stack_fffffffffffff464);
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar5,(error_code *)"Separator is missing at the end of the global map");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
    }
  }
  else {
    pcVar5 = (char *)__cxa_allocate_exception(0x20);
    std::error_code::error_code<std::io_errc,void>
              ((error_code *)in_stack_fffffffffffff468,in_stack_fffffffffffff464);
    std::ios_base::failure[abi:cxx11]::failure(pcVar5,(error_code *)"Invalid PSBT magic bytes");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
LAB_00de85a2:
  __stack_chk_fail();
code_r0x00de818c:
  pcVar5 = (char *)__cxa_allocate_exception(0x20);
  std::error_code::error_code<std::io_errc,void>
            ((error_code *)in_stack_fffffffffffff468,in_stack_fffffffffffff464);
  std::ios_base::failure[abi:cxx11]::failure
            (pcVar5,(error_code *)"Input specifies output index that does not exist");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  goto LAB_00de85a2;
}

Assistant:

inline void Unserialize(Stream& s) {
        // Read the magic bytes
        uint8_t magic[5];
        s >> magic;
        if (!std::equal(magic, magic + 5, PSBT_MAGIC_BYTES)) {
            throw std::ios_base::failure("Invalid PSBT magic bytes");
        }

        // Used for duplicate key detection
        std::set<std::vector<unsigned char>> key_lookup;

        // Track the global xpubs we have already seen. Just for sanity checking
        std::set<CExtPubKey> global_xpubs;

        // Read global data
        bool found_sep = false;
        while(!s.empty()) {
            // Read
            std::vector<unsigned char> key;
            s >> key;

            // the key is empty if that was actually a separator byte
            // This is a special case for key lengths 0 as those are not allowed (except for separator)
            if (key.empty()) {
                found_sep = true;
                break;
            }

            // Type is compact size uint at beginning of key
            SpanReader skey{key};
            uint64_t type = ReadCompactSize(skey);

            // Do stuff based on type
            switch(type) {
                case PSBT_GLOBAL_UNSIGNED_TX:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, unsigned tx already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Global unsigned tx key is more than one byte type");
                    }
                    CMutableTransaction mtx;
                    // Set the stream to serialize with non-witness since this should always be non-witness
                    UnserializeFromVector(s, TX_NO_WITNESS(mtx));
                    tx = std::move(mtx);
                    // Make sure that all scriptSigs and scriptWitnesses are empty
                    for (const CTxIn& txin : tx->vin) {
                        if (!txin.scriptSig.empty() || !txin.scriptWitness.IsNull()) {
                            throw std::ios_base::failure("Unsigned tx does not have empty scriptSigs and scriptWitnesses.");
                        }
                    }
                    break;
                }
                case PSBT_GLOBAL_XPUB:
                {
                    if (key.size() != BIP32_EXTKEY_WITH_VERSION_SIZE + 1) {
                        throw std::ios_base::failure("Size of key was not the expected size for the type global xpub");
                    }
                    // Read in the xpub from key
                    CExtPubKey xpub;
                    xpub.DecodeWithVersion(&key.data()[1]);
                    if (!xpub.pubkey.IsFullyValid()) {
                       throw std::ios_base::failure("Invalid pubkey");
                    }
                    if (global_xpubs.count(xpub) > 0) {
                       throw std::ios_base::failure("Duplicate key, global xpub already provided");
                    }
                    global_xpubs.insert(xpub);
                    // Read in the keypath from stream
                    KeyOriginInfo keypath;
                    DeserializeHDKeypath(s, keypath);

                    // Note that we store these swapped to make searches faster.
                    // Serialization uses xpub -> keypath to enqure key uniqueness
                    if (m_xpubs.count(keypath) == 0) {
                        // Make a new set to put the xpub in
                        m_xpubs[keypath] = {xpub};
                    } else {
                        // Insert xpub into existing set
                        m_xpubs[keypath].insert(xpub);
                    }
                    break;
                }
                case PSBT_GLOBAL_VERSION:
                {
                    if (m_version) {
                        throw std::ios_base::failure("Duplicate Key, version already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Global version key is more than one byte type");
                    }
                    uint32_t v;
                    UnserializeFromVector(s, v);
                    m_version = v;
                    if (*m_version > PSBT_HIGHEST_VERSION) {
                        throw std::ios_base::failure("Unsupported version number");
                    }
                    break;
                }
                case PSBT_GLOBAL_PROPRIETARY:
                {
                    PSBTProprietary this_prop;
                    skey >> this_prop.identifier;
                    this_prop.subtype = ReadCompactSize(skey);
                    this_prop.key = key;

                    if (m_proprietary.count(this_prop) > 0) {
                        throw std::ios_base::failure("Duplicate Key, proprietary key already found");
                    }
                    s >> this_prop.value;
                    m_proprietary.insert(this_prop);
                    break;
                }
                // Unknown stuff
                default: {
                    if (unknown.count(key) > 0) {
                        throw std::ios_base::failure("Duplicate Key, key for unknown value already provided");
                    }
                    // Read in the value
                    std::vector<unsigned char> val_bytes;
                    s >> val_bytes;
                    unknown.emplace(std::move(key), std::move(val_bytes));
                }
            }
        }

        if (!found_sep) {
            throw std::ios_base::failure("Separator is missing at the end of the global map");
        }

        // Make sure that we got an unsigned tx
        if (!tx) {
            throw std::ios_base::failure("No unsigned transaction was provided");
        }

        // Read input data
        unsigned int i = 0;
        while (!s.empty() && i < tx->vin.size()) {
            PSBTInput input;
            s >> input;
            inputs.push_back(input);

            // Make sure the non-witness utxo matches the outpoint
            if (input.non_witness_utxo) {
                if (input.non_witness_utxo->GetHash() != tx->vin[i].prevout.hash) {
                    throw std::ios_base::failure("Non-witness UTXO does not match outpoint hash");
                }
                if (tx->vin[i].prevout.n >= input.non_witness_utxo->vout.size()) {
                    throw std::ios_base::failure("Input specifies output index that does not exist");
                }
            }
            ++i;
        }
        // Make sure that the number of inputs matches the number of inputs in the transaction
        if (inputs.size() != tx->vin.size()) {
            throw std::ios_base::failure("Inputs provided does not match the number of inputs in transaction.");
        }

        // Read output data
        i = 0;
        while (!s.empty() && i < tx->vout.size()) {
            PSBTOutput output;
            s >> output;
            outputs.push_back(output);
            ++i;
        }
        // Make sure that the number of outputs matches the number of outputs in the transaction
        if (outputs.size() != tx->vout.size()) {
            throw std::ios_base::failure("Outputs provided does not match the number of outputs in transaction.");
        }
    }